

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# izmax1.c
# Opt level: O0

int izmax1_slu(int *n,doublecomplex *cx,int *incx)

{
  int local_48;
  int local_44;
  int ix;
  int i;
  double smax;
  double d__1;
  int ret_val;
  int *incx_local;
  doublecomplex *cx_local;
  int *n_local;
  
  if (*n < 1) {
    n_local._4_4_ = 0;
  }
  else {
    d__1._4_4_ = 1;
    if (*n == 1) {
      n_local._4_4_ = 1;
    }
    else if (*incx == 1) {
      _ix = ABS(cx->r);
      for (local_44 = 2; local_44 <= *n; local_44 = local_44 + 1) {
        if (_ix < ABS(cx[local_44 + -1].r)) {
          d__1._4_4_ = local_44;
          _ix = ABS(cx[local_44 + -1].r);
        }
      }
      n_local._4_4_ = d__1._4_4_;
    }
    else {
      _ix = ABS(cx->r);
      local_48 = *incx + 1;
      for (local_44 = 2; local_44 <= *n; local_44 = local_44 + 1) {
        if (_ix < ABS(cx[local_48 + -1].r)) {
          d__1._4_4_ = local_44;
          _ix = ABS(cx[local_48 + -1].r);
        }
        local_48 = *incx + local_48;
      }
      n_local._4_4_ = d__1._4_4_;
    }
  }
  return n_local._4_4_;
}

Assistant:

int
izmax1_slu(int *n, doublecomplex *cx, int *incx)
{


    /* System generated locals */
    int ret_val;
    double d__1;
    
    /* Local variables */
    double smax;
    int i, ix;

#define CX(I) cx[(I)-1]

    ret_val = 0;
    if (*n < 1) {
	return ret_val;
    }
    ret_val = 1;
    if (*n == 1) {
	return ret_val;
    }
    if (*incx == 1) {
	goto L30;
    }

/*     CODE FOR INCREMENT NOT EQUAL TO 1 */

    ix = 1;
    smax = (d__1 = CX(1).r, fabs(d__1));
    ix += *incx;
    for (i = 2; i <= *n; ++i) {
	if ((d__1 = CX(ix).r, fabs(d__1)) <= smax) {
	    goto L10;
	}
	ret_val = i;
	smax = (d__1 = CX(ix).r, fabs(d__1));
L10:
	ix += *incx;
/* L20: */
    }
    return ret_val;

/*     CODE FOR INCREMENT EQUAL TO 1 */

L30:
    smax = (d__1 = CX(1).r, fabs(d__1));
    for (i = 2; i <= *n; ++i) {
	if ((d__1 = CX(i).r, fabs(d__1)) <= smax) {
	    goto L40;
	}
	ret_val = i;
	smax = (d__1 = CX(i).r, fabs(d__1));
L40:
	;
    }
    return ret_val;

/*     End of IZMAX1 */

}